

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.cc
# Opt level: O1

void features::Matching::combine_results(Result *sift_result,Result *surf_result,Result *result)

{
  vector<int,_std::allocator<int>_> *this;
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  piVar1 = (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (surf_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (surf_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (surf_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar7 = (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (surf_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar9 = (result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar9) {
    (result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar9;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (&result->matches_1_2,
             ((long)piVar4 - (long)piVar5 >> 2) + ((long)piVar1 - (long)piVar3 >> 2));
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)result,
             (result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)result,
             (result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (surf_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (surf_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this = &result->matches_2_1;
  piVar1 = (result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            (this,((long)piVar6 - (long)piVar8 >> 2) + ((long)piVar2 - (long)piVar7 >> 2));
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)this,
             (result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::vector<int,std::allocator<int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((vector<int,std::allocator<int>> *)this,
             (result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (surf_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (surf_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  piVar1 = (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (sift_result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)piVar2 - (long)piVar1 >> 2;
  piVar3 = (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (sift_result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (long)piVar3 - (long)piVar4 >> 2;
  piVar5 = (result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != piVar4) {
    piVar3 = (result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = (long)(result->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
    uVar13 = uVar10;
    if (uVar10 < uVar12) {
      do {
        if (-1 < piVar3[uVar13]) {
          piVar3[uVar13] = piVar3[uVar13] + (int)uVar11;
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
  }
  if ((piVar2 != piVar1) &&
     (uVar13 = (long)(result->matches_2_1).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar5 >> 2, uVar11 < uVar13)) {
    do {
      if (-1 < piVar5[uVar11]) {
        piVar5[uVar11] = piVar5[uVar11] + (int)uVar10;
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  return;
}

Assistant:

void
Matching::combine_results(Matching::Result const& sift_result,
    Matching::Result const& surf_result, Matching::Result* result)
{
    /* Determine size of combined matching result. */
    std::size_t num_matches_1 = sift_result.matches_1_2.size()
        + surf_result.matches_1_2.size();
    std::size_t num_matches_2 = sift_result.matches_2_1.size()
        + surf_result.matches_2_1.size();

    /* Combine results. */
    result->matches_1_2.clear();
    result->matches_1_2.reserve(num_matches_1);
    result->matches_1_2.insert(result->matches_1_2.end(),
        sift_result.matches_1_2.begin(), sift_result.matches_1_2.end());
    result->matches_1_2.insert(result->matches_1_2.end(),
        surf_result.matches_1_2.begin(), surf_result.matches_1_2.end());

    result->matches_2_1.clear();
    result->matches_2_1.reserve(num_matches_2);
    result->matches_2_1.insert(result->matches_2_1.end(),
        sift_result.matches_2_1.begin(), sift_result.matches_2_1.end());
    result->matches_2_1.insert(result->matches_2_1.end(),
        surf_result.matches_2_1.begin(), surf_result.matches_2_1.end());

    /* Fix offsets. */
    std::size_t surf_offset_1 = sift_result.matches_1_2.size();
    std::size_t surf_offset_2 = sift_result.matches_2_1.size();

    if (surf_offset_2 > 0)
        for (std::size_t i = surf_offset_1; i < result->matches_1_2.size(); ++i)
            if (result->matches_1_2[i] >= 0)
                result->matches_1_2[i] += surf_offset_2;

    if (surf_offset_1 > 0)
        for (std::size_t i = surf_offset_2; i < result->matches_2_1.size(); ++i)
            if (result->matches_2_1[i] >= 0)
                result->matches_2_1[i] += surf_offset_1;

}